

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void __thiscall helics::apps::WebServer::stopServer(WebServer *this)

{
  string_view message;
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  memory_order in_stack_00000008;
  bool in_stack_0000000f;
  bool *in_stack_00000010;
  atomic<bool> *in_stack_00000018;
  lock_guard<std::mutex> tlock;
  bool exp;
  mutex_type *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000f,in_stack_00000008);
  if (bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    message._M_str = (char *)in_RDI;
    message._M_len = (size_t)in_stack_ffffffffffffffb8;
    TypedBrokerServer::logMessage(message);
    CLI::std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
    CLI::std::
    __shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1fec54);
    boost::asio::io_context::stop((io_context *)0x1fec5c);
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1fec68);
  }
  return;
}

Assistant:

void WebServer::stopServer()
{
    bool exp{true};
    if (running.compare_exchange_strong(exp, false)) {
        logMessage("stopping broker web server");
        const std::lock_guard<std::mutex> tlock(threadGuard);
        context->ioc.stop();
    }
}